

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetModuleOrDeviceList
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,size_t numberOfDevices
          ,SINGLYLINKEDLIST_HANDLE deviceOrModuleList,IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type,
          int struct_version)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  JSON_Status JVar2;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE responseBuffer;
  uchar *puVar4;
  JSON_Value *value;
  JSON_Array *array;
  size_t sVar5;
  JSON_Object *root_object;
  LIST_ITEM_HANDLE pLVar6;
  IOTHUB_MODULE *pIVar7;
  LIST_ITEM_HANDLE pLVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  IOTHUB_MODULE *moduleInfo;
  size_t index;
  IOTHUB_DEVICE_OR_MODULE local_d0;
  
  if (registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0 ||
      deviceOrModuleList == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar10 = "Input parameter cannot be NULL";
    iVar9 = 0x718;
  }
  else {
    if (0xfffffffffffffc17 < numberOfDevices - 0x3e9) {
      if (struct_version != 1 && struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE) {
        p_Var3 = xlogging_get_log_function();
        IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
        }
        pcVar10 = "Invalid module version";
        iVar9 = 0x722;
        goto LAB_00149601;
      }
      responseBuffer = BUFFER_new();
      if (responseBuffer == (BUFFER_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_REGISTRYMANAGER_ERROR;
        }
        pcVar10 = "BUFFER_new failed for responseBuffer";
        iVar9 = 0x72b;
        goto LAB_00149601;
      }
      IVar1 = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_GET_DEVICE_LIST,deviceId,
                                  (char *)0x0,(BUFFER_HANDLE)0x0,numberOfDevices,responseBuffer);
      if (IVar1 != IOTHUB_REGISTRYMANAGER_OK) {
        if (IVar1 == IOTHUB_REGISTRYMANAGER_ERROR) {
          IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"IoTHubRegistryManager_GetModuleOrDeviceList",0x730,1,
                      "Failure sending HTTP request for get device list");
          }
        }
        goto LAB_001496af;
      }
      puVar4 = BUFFER_u_char(responseBuffer);
      if (puVar4 == (uchar *)0x0) {
        p_Var3 = xlogging_get_log_function();
        IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar10 = "BUFFER_u_char failed";
          iVar9 = 0x350;
LAB_001499e3:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"parseDeviceOrModuleListJson",iVar9,1,pcVar10);
        }
      }
      else {
        value = json_parse_string((char *)0x14974b);
        if (value == (JSON_Value *)0x0) {
          p_Var3 = xlogging_get_log_function();
          IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar10 = "json_parse_string failed";
            iVar9 = 0x355;
            goto LAB_001499e3;
          }
        }
        else {
          array = json_value_get_array(value);
          if (array == (JSON_Array *)0x0) {
            p_Var3 = xlogging_get_log_function();
            IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar10 = "json_value_get_object failed";
              iVar9 = 0x35a;
LAB_00149ad6:
              IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"parseDeviceOrModuleListJson",iVar9,1,pcVar10);
            }
          }
          else {
            sVar5 = json_array_get_count(array);
            index = 0;
            do {
              if (sVar5 == index) {
                IVar1 = IOTHUB_REGISTRYMANAGER_OK;
                break;
              }
              root_object = json_array_get_object(array,index);
              if (root_object == (JSON_Object *)0x0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar10 = "json_array_get_object failed";
                  iVar9 = 0x369;
LAB_00149a87:
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"parseDeviceOrModuleListJson",iVar9,1,pcVar10);
                }
LAB_00149a8c:
                IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                break;
              }
              memset(&local_d0,0,0xa0);
              local_d0.connectionState = IOTHUB_DEVICE_CONNECTION_STATE_DISCONNECTED;
              local_d0.status = IOTHUB_DEVICE_CONNECTION_STATE_DISCONNECTED;
              IVar1 = parseDeviceOrModuleJsonObject(root_object,&local_d0);
              if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
                if (struct_type != IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE) {
                  pIVar7 = (IOTHUB_MODULE *)malloc(0xa0);
                  if (pIVar7 == (IOTHUB_MODULE *)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      pcVar10 = "addDeviceOrModuleToLinkedListAsModule";
                      iVar9 = 0x321;
                      pcVar11 = "Malloc failed for module";
LAB_00149906:
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                ,pcVar10,iVar9,1,pcVar11);
                      IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
                    }
                  }
                  else {
                    pIVar7->version = struct_version;
                    move_deviceOrModule_members_to_module(&local_d0,pIVar7);
                    pLVar6 = singlylinkedlist_add(deviceOrModuleList,pIVar7);
                    IVar1 = IOTHUB_REGISTRYMANAGER_OK;
                    if (pLVar6 != (LIST_ITEM_HANDLE)0x0) goto LAB_00149956;
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                ,"addDeviceOrModuleToLinkedListAsModule",0x32c,1,
                                "singlylinkedlist_add failed");
                    }
LAB_00149943:
                    free(pIVar7);
                    IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                  }
                  goto LAB_00149951;
                }
                pIVar7 = (IOTHUB_MODULE *)malloc(0x88);
                if (pIVar7 == (IOTHUB_MODULE *)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    pcVar10 = "addDeviceOrModuleToLinkedListAsDevice";
                    iVar9 = 0x303;
                    pcVar11 = "Malloc failed for device";
                    goto LAB_00149906;
                  }
                  goto LAB_00149951;
                }
                move_deviceOrModule_members_to_device(&local_d0,(IOTHUB_DEVICE *)pIVar7);
                pLVar6 = singlylinkedlist_add(deviceOrModuleList,pIVar7);
                if (pLVar6 == (LIST_ITEM_HANDLE)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                              ,"addDeviceOrModuleToLinkedListAsDevice",0x30d,1,
                              "singlylinkedlist_add failed");
                  }
                  goto LAB_00149943;
                }
                free_nonDevice_members_from_deviceOrModule(&local_d0);
                IVar1 = IOTHUB_REGISTRYMANAGER_OK;
              }
              else {
LAB_00149951:
                free_deviceOrModule_members(&local_d0);
              }
LAB_00149956:
              JVar2 = json_object_clear(root_object);
              if (JVar2 != 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar10 = "json_object_clear failed";
                  iVar9 = 0x38e;
                  goto LAB_00149a87;
                }
                goto LAB_00149a8c;
              }
              index = index + 1;
            } while (IVar1 == IOTHUB_REGISTRYMANAGER_OK);
            JVar2 = json_array_clear(array);
            if (JVar2 != 0) {
              p_Var3 = xlogging_get_log_function();
              IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
              if (p_Var3 != (LOGGER_LOG)0x0) {
                pcVar10 = "json_array_clear failed";
                iVar9 = 0x39c;
                goto LAB_00149ad6;
              }
            }
          }
          json_value_free(value);
          if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
            IVar1 = IOTHUB_REGISTRYMANAGER_OK;
            goto LAB_001496af;
          }
        }
      }
      pLVar6 = singlylinkedlist_get_head_item(deviceOrModuleList);
      while (pLVar6 != (LIST_ITEM_HANDLE)0x0) {
        pIVar7 = (IOTHUB_MODULE *)singlylinkedlist_item_get_value(pLVar6);
        if (struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE) {
          free(*(void **)pIVar7);
          free(pIVar7->deviceId);
          free(pIVar7->primaryKey);
          free(pIVar7->secondaryKey);
          free(pIVar7->generationId);
          free(*(void **)&pIVar7->connectionState);
          free(*(void **)&pIVar7->status);
          free(pIVar7->statusReason);
          free(pIVar7->statusUpdatedTime);
          free(*(void **)&pIVar7->isManaged);
          free(pIVar7->configuration);
          free(pIVar7->deviceProperties);
        }
        else {
          IoTHubRegistryManager_FreeModuleMembers(pIVar7);
        }
        free(pIVar7);
        pLVar8 = singlylinkedlist_get_next_item(pLVar6);
        singlylinkedlist_remove(deviceOrModuleList,pLVar6);
        pLVar6 = pLVar8;
      }
LAB_001496af:
      BUFFER_delete(responseBuffer);
      return IVar1;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar10 = "numberOfDevices has to be between 1 and 1000";
    iVar9 = 0x71d;
  }
  IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
LAB_00149601:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_GetModuleOrDeviceList",iVar9,1,pcVar10);
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetModuleOrDeviceList(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, size_t numberOfDevices, SINGLYLINKEDLIST_HANDLE deviceOrModuleList, IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type, int struct_version)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleList == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((numberOfDevices == 0) || (numberOfDevices > IOTHUB_DEVICES_MAX_REQUEST))
    {
        LogError("numberOfDevices has to be between 1 and 1000");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE) && ((struct_version < IOTHUB_MODULE_VERSION_1) || (struct_version > IOTHUB_MODULE_VERSION_LATEST)))
    {
        LogError("Invalid module version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        BUFFER_HANDLE responseBuffer = NULL;

        if ((responseBuffer = BUFFER_new()) == NULL)
        {
            LogError("BUFFER_new failed for responseBuffer");
            result = IOTHUB_REGISTRYMANAGER_ERROR;
        }
        else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_GET_DEVICE_LIST, deviceId, NULL, NULL, numberOfDevices, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
        {
            LogError("Failure sending HTTP request for get device list");
        }
        else if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            result = parseDeviceOrModuleListJson(responseBuffer, deviceOrModuleList, struct_type, struct_version);
        }

        if (responseBuffer != NULL)
        {
            BUFFER_delete(responseBuffer);
        }
    }
    return result;
}